

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphMaker.cc
# Opt level: O0

array<unsigned___int128,_4UL> * kmer_fw_neighbours128(__uint128_t kmer,uint8_t k)

{
  byte bVar1;
  ulong uVar2;
  reference pvVar3;
  char in_CL;
  ulong uVar4;
  long in_RDX;
  array<unsigned___int128,_4UL> *this;
  ulong in_RSI;
  array<unsigned___int128,_4UL> *in_RDI;
  ulong uVar5;
  bool bVar6;
  __uint128_t i;
  undefined8 local_48;
  undefined8 local_40;
  
  local_48 = 0;
  for (local_40 = 0; local_40 == 0 && (ulong)(3 < local_48) <= (ulong)-local_40;
      local_40 = local_40 + (ulong)bVar6) {
    bVar1 = in_CL * '\x02';
    uVar5 = 1L << (bVar1 & 0x3f);
    uVar4 = uVar5;
    uVar2 = 0L << (bVar1 & 0x3f) | 1UL >> 0x40 - (bVar1 & 0x3f);
    if ((bVar1 & 0x40) != 0) {
      uVar4 = 0;
      uVar2 = uVar5;
    }
    this = (array<unsigned___int128,_4UL> *)
           ((in_RDX << 2 | in_RSI >> 0x3e) + local_40 + (ulong)CARRY8(in_RSI * 4,local_48) &
           (uVar2 - 1) + (ulong)(uVar4 != 0));
    uVar2 = in_RSI * 4 + local_48 & uVar4 - 1;
    pvVar3 = std::array<unsigned___int128,_4UL>::operator[](this,uVar2);
    *(ulong *)pvVar3 = uVar2;
    *(array<unsigned___int128,_4UL> **)((long)pvVar3 + 8) = this;
    bVar6 = 0xfffffffffffffffe < local_48;
    local_48 = local_48 + 1;
  }
  return in_RDI;
}

Assistant:

std::array<__uint128_t,4> kmer_fw_neighbours128(__uint128_t kmer, uint8_t k) {
    std::array<__uint128_t,4> n;
    for (__uint128_t i=0;i<4;++i){
        n[i]=((kmer<<2)+i)%(((__uint128_t) 1)<<(k*2));
    }
    return n;
}